

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gen.pvip.y.c
# Opt level: O0

void yyPush(GREG *G,char *text,int count,yythunk *thunk,PVIPParserContext yyxvar)

{
  ulong uVar1;
  PVIPNode **ppPVar2;
  size_t off;
  yythunk *thunk_local;
  int count_local;
  char *text_local;
  GREG *G_local;
  
  uVar1 = ((long)G->val - (long)G->vals >> 3) + (long)count;
  if ((ulong)(long)G->valslen < uVar1) {
    while ((ulong)(long)G->valslen < uVar1 + 1) {
      G->valslen = G->valslen << 1;
    }
    ppPVar2 = (PVIPNode **)realloc(G->vals,(long)G->valslen << 3);
    G->vals = ppPVar2;
    G->val = G->vals + uVar1;
  }
  else {
    G->val = G->val + count;
  }
  return;
}

Assistant:

YY_LOCAL(void) yyPush(GREG *G, char *text, int count, yythunk *thunk, YY_XTYPE YY_XVAR)	{
  size_t off = (G->val - G->vals) + count;
  if (off > G->valslen) {
    while (G->valslen < off + 1)
      G->valslen *= 2;
    G->vals= (YYSTYPE*)YY_REALLOC((void *)G->vals, sizeof(YYSTYPE) * G->valslen, G->data);
    G->val= G->vals + off;
  } else {
    G->val += count;
  }
}